

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
::reject(AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
         *this,Exception *exception)

{
  Exception *exception_00;
  ExceptionOr<kj::HttpClient::WebSocketResponse> local_1f0;
  Exception *local_18;
  Exception *exception_local;
  AdapterPromiseNode<kj::HttpClient::WebSocketResponse,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::WebSocketResponse>_>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = exception;
    exception_local = (Exception *)this;
    exception_00 = mv<kj::Exception>(exception);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::ExceptionOr(&local_1f0,false,exception_00);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::operator=(&this->result,&local_1f0);
    ExceptionOr<kj::HttpClient::WebSocketResponse>::~ExceptionOr(&local_1f0);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }